

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

void __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::~hash_map(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
            *this)

{
  raw_node *prVar1;
  void *p;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(this->m_values).m_size;
  if (uVar4 != 0) {
    prVar1 = (this->m_values).m_p;
    uVar2 = this->m_num_valid;
    lVar3 = 0;
    do {
      if (prVar1->m_bits[lVar3 + 0x1c] != '\0') {
        p = *(void **)(prVar1->m_bits + lVar3);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        uVar2 = uVar2 - 1;
        if (uVar2 == 0) break;
      }
      lVar3 = lVar3 + 0x20;
    } while (uVar4 << 5 != lVar3);
    prVar1 = (this->m_values).m_p;
    if (prVar1 != (raw_node *)0x0) {
      crnlib_free(prVar1);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    this->m_num_valid = 0;
    this->m_grow_threshold = 0;
  }
  prVar1 = (this->m_values).m_p;
  if (prVar1 != (raw_node *)0x0) {
    uVar4 = (ulong)(this->m_values).m_size;
    if (uVar4 != 0) {
      lVar3 = 0;
      do {
        if ((prVar1->m_bits[lVar3 + 0x1c] != '\0') &&
           (*(void **)(prVar1->m_bits + lVar3) != (void *)0x0)) {
          crnlib_free(*(void **)(prVar1->m_bits + lVar3));
        }
        lVar3 = lVar3 + 0x20;
      } while (uVar4 << 5 != lVar3);
    }
    crnlib_free((this->m_values).m_p);
  }
  return;
}

Assistant:

inline ~hash_map()
        {
            clear();
        }